

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOSTypes.cpp
# Opt level: O1

string * __thiscall
adios2::ToString_abi_cxx11_(string *__return_storage_ptr__,adios2 *this,TimeUnit value)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "TimeUnit::Microseconds";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "TimeUnit::Milliseconds";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "TimeUnit::Seconds";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "TimeUnit::Minutes";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "TimeUnit::Hours";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "ToString: Unknown TimeUnit";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(TimeUnit value)
{
    switch (value)
    {
    case TimeUnit::Microseconds:
        return "TimeUnit::Microseconds";
    case TimeUnit::Milliseconds:
        return "TimeUnit::Milliseconds";
    case TimeUnit::Seconds:
        return "TimeUnit::Seconds";
    case TimeUnit::Minutes:
        return "TimeUnit::Minutes";
    case TimeUnit::Hours:
        return "TimeUnit::Hours";
    default:
        return "ToString: Unknown TimeUnit";
    }
}